

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::reportInvalidArguments(ConsoleReporter *this,string *arg)

{
  ostream *poVar1;
  string *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(*(ostream **)(in_RDI + 0x18),"Invalid Filter: ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::reportInvalidArguments(std::string const&arg){
    stream << "Invalid Filter: " << arg << '\n';
}